

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP5Deserializer::GetAbsoluteSteps
          (BP5Deserializer *this,VariableBase *Var,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *keys)

{
  BP5VarRec *VarRec;
  pointer puVar1;
  pointer puVar2;
  iterator __position;
  const_iterator cVar3;
  size_t *psVar4;
  void *pvVar5;
  size_t WriterRank;
  ulong WriterRank_00;
  VariableBase *local_38;
  
  local_38 = Var;
  cVar3 = std::
          _Hashtable<void_*,_std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>,_std::allocator<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->VarByKey)._M_h,&local_38);
  if (this->m_RandomAccessMode == true) {
    VarRec = *(BP5VarRec **)
              ((long)cVar3.
                     super__Node_iterator_base<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>,_false>
                     ._M_cur + 0x10);
    local_38 = (VariableBase *)0x0;
    if ((this->m_ControlArray).
        super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_ControlArray).
        super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      WriterRank_00 = 0;
LAB_00615d7c:
      do {
        psVar4 = &this->m_CurrentWriterCohortSize;
        if (this->m_RandomAccessMode == true) {
          puVar1 = (this->m_WriterCohortSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar2 = (this->m_WriterCohortSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_38 < (VariableBase *)((long)puVar2 - (long)puVar1 >> 3)) {
            psVar4 = puVar1 + (long)local_38;
          }
          else {
            psVar4 = puVar2 + -1;
          }
        }
        if (WriterRank_00 < *psVar4) {
          pvVar5 = GetMetadataBase(this,VarRec,(size_t)local_38,WriterRank_00);
          WriterRank_00 = WriterRank_00 + 1;
          if (pvVar5 == (void *)0x0) goto LAB_00615d7c;
          __position._M_current =
               (keys->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (keys->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)keys,__position,
                       (unsigned_long *)&local_38);
          }
          else {
            *__position._M_current = (unsigned_long)local_38;
            (keys->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        local_38 = (VariableBase *)((long)&local_38->_vptr_VariableBase + 1);
        WriterRank_00 = 0;
      } while (local_38 <
               (VariableBase *)
               (((long)(this->m_ControlArray).
                       super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_ControlArray).
                       super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
    }
  }
  return;
}

Assistant:

void BP5Deserializer::GetAbsoluteSteps(const VariableBase &Var, std::vector<size_t> &keys) const
{
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);
    if (!m_RandomAccessMode)
        return;

    for (size_t Step = 0; Step < m_ControlArray.size(); Step++)
    {
        for (size_t WriterRank = 0; WriterRank < WriterCohortSize(Step); WriterRank++)
        {
            MetaArrayRec *writer_meta_base =
                (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);
            if (writer_meta_base)
            {
                keys.push_back(Step);
                break;
            }
        }
    }
}